

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_generic_expt(sexp ctx,sexp x,sexp_sint_t e)

{
  ulong in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp *local_48;
  undefined8 local_40;
  sexp local_38;
  sexp *local_30;
  undefined8 local_28;
  sexp local_20;
  ulong local_18;
  sexp local_10;
  long local_8;
  
  local_20 = (sexp)0x43e;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_38 = (sexp)0x43e;
  memset(&local_48,0,0x10);
  local_30 = &local_20;
  local_28 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp ***)(local_8 + 0x6080) = &local_30;
  local_48 = &local_38;
  local_40 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp ***)(local_8 + 0x6080) = &local_48;
  local_20 = (sexp)&DAT_00000003;
  local_38 = local_10;
  for (; 0 < (long)local_18; local_18 = (long)local_18 >> 1) {
    if ((local_18 & 1) != 0) {
      local_20 = sexp_mul(in_stack_00000050,in_stack_00000048,ctx);
    }
    local_38 = sexp_mul(in_stack_00000050,in_stack_00000048,ctx);
  }
  *(undefined8 *)(local_8 + 0x6080) = local_28;
  return local_20;
}

Assistant:

sexp sexp_generic_expt (sexp ctx, sexp x, sexp_sint_t e) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res = SEXP_ONE, tmp = x; e > 0; e >>= 1) {
    if (e&1) res = sexp_mul(ctx, res, tmp);
    tmp = sexp_mul(ctx, tmp, tmp);
  }
  sexp_gc_release2(ctx);
  return res;
}